

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_rep_flat.h
# Opt level: O0

void absl::cord_internal::CordRepFlat::Delete(CordRep *rep)

{
  bool bVar1;
  size_t sVar2;
  size_t size;
  CordRep *rep_local;
  
  bVar1 = false;
  if (5 < rep->tag) {
    bVar1 = rep->tag < 0xf9;
  }
  if (!bVar1) {
    __assert_fail("rep->tag >= FLAT && rep->tag <= MAX_FLAT_TAG",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]pawn/build_O0/_deps/absl-src/absl/strings/internal/cord_rep_flat.h"
                  ,0x92,"static void absl::cord_internal::CordRepFlat::Delete(CordRep *)");
  }
  sVar2 = TagToAllocatedSize(rep->tag);
  operator_delete(rep,sVar2);
  return;
}

Assistant:

static void Delete(CordRep*rep) {
    assert(rep->tag >= FLAT && rep->tag <= MAX_FLAT_TAG);

#if defined(__cpp_sized_deallocation)
    size_t size = TagToAllocatedSize(rep->tag);
    rep->~CordRep();
    ::operator delete(rep, size);
#else
    rep->~CordRep();
    ::operator delete(rep);
#endif
  }